

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.h
# Opt level: O1

void __thiscall
rest_rpc::rpc_service::router::
register_handler<false,person(*)(std::weak_ptr<rest_rpc::rpc_service::connection>)>
          (router *this,string *name,_func_person_weak_ptr<rest_rpc::rpc_service::connection> *f,
          bool pub)

{
  char *pcVar1;
  char *message;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  mapped_type *this_00;
  invalid_argument *this_01;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  IntermediateData IVar9;
  uint32_t key;
  uint local_30;
  uint local_2c;
  anon_class_8_1_54a39806_conflict3 local_28;
  
  message = (name->_M_dataplus)._M_p;
  lVar6 = 0;
  do {
    pcVar1 = message + lVar6;
    lVar6 = lVar6 + 1;
  } while (*pcVar1 != '\0');
  IVar9 = MD5::MD5CE::ProcessMessage(message,(int)lVar6 - 1);
  uVar4 = IVar9.a;
  local_30 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
  uVar2 = (this->key2func_name_)._M_h._M_bucket_count;
  uVar5 = (ulong)local_30 % uVar2;
  p_Var7 = (this->key2func_name_)._M_h._M_buckets[uVar5];
  p_Var8 = (__node_base_ptr)0x0;
  if ((p_Var7 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var7->_M_nxt, p_Var8 = p_Var7, local_30 != *(uint *)&p_Var7->_M_nxt[1]._M_nxt)) {
    while (p_Var7 = p_Var3, p_Var3 = p_Var7->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var8 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var3[1]._M_nxt % uVar2 != uVar5) ||
         (p_Var8 = p_Var7, local_30 == *(uint *)&p_Var3[1]._M_nxt)) goto LAB_00152066;
    }
    p_Var8 = (__node_base_ptr)0x0;
  }
LAB_00152066:
  if ((p_Var8 != (__node_base_ptr)0x0) && (p_Var8->_M_nxt != (_Hash_node_base *)0x0)) {
    this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_01,"duplicate registration key !");
    __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<unsigned_int&,std::__cxx11::string_const&>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->key2func_name_,&local_30,name);
  local_2c = local_30;
  local_28.f = f;
  this_00 = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::function<void_(std::weak_ptr<rest_rpc::rpc_service::connection>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(std::weak_ptr<rest_rpc::rpc_service::connection>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::function<void_(std::weak_ptr<rest_rpc::rpc_service::connection>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(std::weak_ptr<rest_rpc::rpc_service::connection>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this,&local_2c);
  std::
  function<void(std::weak_ptr<rest_rpc::rpc_service::connection>,nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&)>
  ::operator=((function<void(std::weak_ptr<rest_rpc::rpc_service::connection>,nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&)>
               *)this_00,&local_28);
  return;
}

Assistant:

void register_handler(std::string const &name, Function f, bool pub = false) {
    uint32_t key = MD5::MD5Hash32(name.data());
    if (key2func_name_.find(key) != key2func_name_.end()) {
      throw std::invalid_argument("duplicate registration key !");
    } else {
      key2func_name_.emplace(key, name);
      return register_nonmember_func<is_pub>(key, std::move(f));
    }
  }